

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

void WriteDump(aiScene *scene,FILE *out,char *src,char *cmd,bool shortened)

{
  long lVar1;
  aiAnimation *in;
  aiNodeAnim *in_00;
  aiMesh *this;
  aiBone *in_01;
  aiString *paVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 *puVar7;
  double dVar8;
  char *pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  aiFace *paVar14;
  char *pcVar15;
  char *pcVar16;
  undefined8 in_stack_fffffffffffff918;
  undefined4 uVar17;
  undefined8 in_stack_fffffffffffff920;
  uint uVar18;
  uint local_67c;
  uint local_674;
  uint local_620;
  uint local_61c;
  uint n_11;
  uint a_6;
  uint n_10;
  uint n_9;
  uint a_5;
  uint n_8;
  uint n_7;
  uint n_6;
  uint n_5;
  uint j;
  aiFace *f;
  uint n_4;
  aiVertexWeight *wght;
  uint a_4;
  aiBone *bone;
  uint n_3;
  aiMesh *mesh;
  uint i_3;
  aiQuatKey *vc_2;
  uint a_3;
  aiVectorKey *vc_1;
  uint a_2;
  aiVectorKey *vc;
  uint a_1;
  aiNodeAnim *nd;
  uint n_2;
  aiAnimation *anim;
  uint i_2;
  string local_548;
  uint local_524;
  uint local_520;
  uint p_3;
  uint p_2;
  uint p_1;
  char *sz;
  aiMaterialProperty *prop;
  aiMaterial *paStack_500;
  uint n_1;
  aiMaterial *mat;
  uint local_4f0;
  uint i_1;
  uint a;
  uint b;
  uint g;
  uint r;
  aiTexel *tx;
  uint x;
  uint y;
  uint n;
  bool compressed;
  aiTexture *tex;
  uint i;
  aiString name;
  size_type s;
  allocator<char> local_99;
  string local_98 [8];
  string c;
  tm *p;
  tm now;
  time_t tt;
  bool shortened_local;
  char *cmd_local;
  char *src_local;
  FILE *out_local;
  aiScene *scene_local;
  
  now.tm_zone = (char *)time((time_t *)0x0);
  c.field_2._8_8_ = gmtime_r((time_t *)&now.tm_zone,(tm *)&p);
  if ((tm *)c.field_2._8_8_ != (tm *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,cmd,&local_99);
    std::allocator<char>::~allocator(&local_99);
    while( true ) {
      name.data._1016_8_ = std::__cxx11::string::find((char *)local_98,0xb56d59);
      uVar18 = (uint)((ulong)in_stack_fffffffffffff920 >> 0x20);
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffff918 >> 0x20);
      if (name.data._1016_8_ == -1) break;
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_98);
      *puVar7 = 0x3f;
    }
    aiString::aiString((aiString *)((long)&tex + 4));
    uVar4 = aiGetVersionMajor();
    uVar5 = aiGetVersionMinor();
    uVar6 = aiGetVersionRevision();
    dVar8 = (double)std::__cxx11::string::c_str();
    pcVar9 = asctime((tm *)c.field_2._8_8_);
    fprintf((FILE *)out,
            "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<ASSIMP format_id=\"1\">\n\n<!-- XML Model dump produced by assimp dump\n  Library version: %u.%u.%u\n  Source: %s\n  Command line: %s\n  %s\n--> \n\n<Scene flags=\"%u\" postprocessing=\"%i\">\n"
            ,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,src,dVar8,pcVar9,CONCAT44(uVar17,scene->mFlags),
            (ulong)uVar18 << 0x20);
    WriteNode(scene->mRootNode,out,0);
    if (scene->mNumTextures != 0) {
      fprintf((FILE *)out,"<TextureList num=\"%u\">\n",(ulong)scene->mNumTextures);
      for (tex._0_4_ = 0; (uint)tex < scene->mNumTextures; tex._0_4_ = (uint)tex + 1) {
        _n = scene->mTextures[(uint)tex];
        y._3_1_ = _n->mHeight == 0;
        if ((bool)y._3_1_) {
          local_674 = 0xffffffff;
          local_67c = 0xffffffff;
        }
        else {
          local_674 = _n->mWidth;
          local_67c = _n->mHeight;
        }
        pcVar9 = "false";
        if ((bool)y._3_1_) {
          pcVar9 = "true";
        }
        fprintf((FILE *)out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
                (ulong)local_674,(ulong)local_67c,pcVar9);
        if ((y._3_1_ & 1) == 0) {
          if (!shortened) {
            fprintf((FILE *)out,"\t\t<Data length=\"%i\"> \n",(ulong)(_n->mWidth * _n->mHeight * 4))
            ;
            for (tx._4_4_ = 0; tx._4_4_ < _n->mHeight; tx._4_4_ = tx._4_4_ + 1) {
              for (tx._0_4_ = 0; (uint)tx < _n->mWidth; tx._0_4_ = (uint)tx + 1) {
                _g = _n->pcData + (ulong)(tx._4_4_ * _n->mWidth) + (ulong)(uint)tx;
                b = (uint)_g->r;
                a = (uint)_g->g;
                i_1 = (uint)_g->b;
                local_4f0 = (uint)_g->a;
                fprintf((FILE *)out,"\t\t\t%2x %2x %2x %2x",(ulong)b,(ulong)a,(ulong)i_1,
                        (ulong)local_4f0);
                if (((uint)tx + tx._4_4_ * _n->mWidth & 3) == 0) {
                  fprintf((FILE *)out,"\n");
                }
              }
            }
          }
        }
        else {
          fprintf((FILE *)out,"\t\t<Data length=\"%u\"> \n",(ulong)_n->mWidth);
          if (!shortened) {
            for (x = 0; x < _n->mWidth; x = x + 1) {
              fprintf((FILE *)out,"\t\t\t%2x",(ulong)(&_n->pcData->b)[x]);
              if ((x != 0) && (x % 0x32 == 0)) {
                fprintf((FILE *)out,"\n");
              }
            }
          }
        }
        fprintf((FILE *)out,"\t\t</Data>\n\t</Texture>\n");
      }
      fprintf((FILE *)out,"</TextureList>\n");
    }
    if (scene->mNumMaterials != 0) {
      fprintf((FILE *)out,"<MaterialList num=\"%u\">\n",(ulong)scene->mNumMaterials);
      for (mat._4_4_ = 0; mat._4_4_ < scene->mNumMaterials; mat._4_4_ = mat._4_4_ + 1) {
        paStack_500 = scene->mMaterials[mat._4_4_];
        fprintf((FILE *)out,"\t<Material>\n");
        fprintf((FILE *)out,"\t\t<MatPropertyList  num=\"%u\">\n",(ulong)paStack_500->mNumProperties
               );
        for (prop._4_4_ = 0; prop._4_4_ < paStack_500->mNumProperties; prop._4_4_ = prop._4_4_ + 1)
        {
          sz = (char *)paStack_500->mProperties[prop._4_4_];
          _p_2 = "";
          if (((aiMaterialProperty *)sz)->mType == aiPTI_Float) {
            _p_2 = "float";
          }
          else if (((aiMaterialProperty *)sz)->mType == aiPTI_Integer) {
            _p_2 = "integer";
          }
          else if (((aiMaterialProperty *)sz)->mType == aiPTI_String) {
            _p_2 = "string";
          }
          else if (((aiMaterialProperty *)sz)->mType == aiPTI_Buffer) {
            _p_2 = "binary_buffer";
          }
          pcVar9 = _p_2;
          paVar2 = &((aiMaterialProperty *)sz)->mKey;
          pcVar10 = TextureTypeToString(((aiMaterialProperty *)sz)->mSemantic);
          fprintf((FILE *)out,
                  "\t\t\t<MatProperty key=\"%s\" \n\t\t\ttype=\"%s\" tex_usage=\"%s\" tex_index=\"%u\""
                  ,paVar2->data,pcVar9,pcVar10,(ulong)*(uint *)(sz + 0x408));
          if (*(int *)(sz + 0x410) == 1) {
            fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)(*(uint *)(sz + 0x40c) >> 2));
            for (p_3 = 0; p_3 < *(uint *)(sz + 0x40c) >> 2; p_3 = p_3 + 1) {
              fprintf((FILE *)out,"%f ",(double)*(float *)(*(long *)(sz + 0x418) + (ulong)p_3 * 4));
            }
          }
          else if (*(int *)(sz + 0x410) == 4) {
            fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)(*(uint *)(sz + 0x40c) >> 2));
            for (local_520 = 0; local_520 < *(uint *)(sz + 0x40c) >> 2; local_520 = local_520 + 1) {
              fprintf((FILE *)out,"%i ",
                      (ulong)*(uint *)(*(long *)(sz + 0x418) + (ulong)local_520 * 4));
            }
          }
          else if (*(int *)(sz + 0x410) == 5) {
            fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)*(uint *)(sz + 0x40c));
            for (local_524 = 0; local_524 < *(uint *)(sz + 0x40c); local_524 = local_524 + 1) {
              fprintf((FILE *)out,"%2x ",
                      (ulong)(uint)(int)*(char *)(*(long *)(sz + 0x418) + (ulong)local_524));
              if ((local_524 != 0) && (local_524 % 0x1e == 0)) {
                fprintf((FILE *)out,"\n\t\t\t\t");
              }
            }
          }
          else if (*(int *)(sz + 0x410) == 3) {
            lVar1 = *(long *)(sz + 0x418);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i_2,(char *)(lVar1 + 4),(allocator<char> *)((long)&anim + 7));
            encodeXML(&local_548,(string *)&i_2);
            uVar11 = std::__cxx11::string::c_str();
            fprintf((FILE *)out,">\n\t\t\t\t\"%s\"",uVar11);
            std::__cxx11::string::~string((string *)&local_548);
            std::__cxx11::string::~string((string *)&i_2);
            std::allocator<char>::~allocator((allocator<char> *)((long)&anim + 7));
          }
          fprintf((FILE *)out,"\n\t\t\t</MatProperty>\n");
        }
        fprintf((FILE *)out,"\t\t</MatPropertyList>\n");
        fprintf((FILE *)out,"\t</Material>\n");
      }
      fprintf((FILE *)out,"</MaterialList>\n");
    }
    if (scene->mNumAnimations != 0) {
      fprintf((FILE *)out,"<AnimationList num=\"%u\">\n",(ulong)scene->mNumAnimations);
      for (anim._0_4_ = 0; (uint)anim < scene->mNumAnimations; anim._0_4_ = (uint)anim + 1) {
        in = scene->mAnimations[(uint)anim];
        ConvertName((aiString *)((long)&tex + 4),&in->mName);
        fprintf((FILE *)out,"\t<Animation name=\"%s\" duration=\"%e\" tick_cnt=\"%e\">\n",
                in->mDuration,in->mTicksPerSecond,&i);
        if (in->mNumChannels != 0) {
          fprintf((FILE *)out,"\t\t<NodeAnimList num=\"%u\">\n",(ulong)in->mNumChannels);
          for (nd._4_4_ = 0; nd._4_4_ < in->mNumChannels; nd._4_4_ = nd._4_4_ + 1) {
            in_00 = in->mChannels[nd._4_4_];
            ConvertName((aiString *)((long)&tex + 4),&in_00->mNodeName);
            fprintf((FILE *)out,"\t\t\t<NodeAnim node=\"%s\">\n",&i);
            if (!shortened) {
              if (in_00->mNumPositionKeys != 0) {
                fprintf((FILE *)out,"\t\t\t\t<PositionKeyList num=\"%u\">\n",
                        (ulong)in_00->mNumPositionKeys);
                for (vc._4_4_ = 0; vc._4_4_ < in_00->mNumPositionKeys; vc._4_4_ = vc._4_4_ + 1) {
                  paVar12 = in_00->mPositionKeys + vc._4_4_;
                  fprintf((FILE *)out,
                          "\t\t\t\t\t<PositionKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</PositionKey>\n"
                          ,paVar12->mTime,(double)(paVar12->mValue).x,(double)(paVar12->mValue).y,
                          (double)(paVar12->mValue).z);
                }
                fprintf((FILE *)out,"\t\t\t\t</PositionKeyList>\n");
              }
              if (in_00->mNumScalingKeys != 0) {
                fprintf((FILE *)out,"\t\t\t\t<ScalingKeyList num=\"%u\">\n",
                        (ulong)in_00->mNumScalingKeys);
                for (vc_1._4_4_ = 0; vc_1._4_4_ < in_00->mNumScalingKeys;
                    vc_1._4_4_ = vc_1._4_4_ + 1) {
                  paVar12 = in_00->mScalingKeys + vc_1._4_4_;
                  fprintf((FILE *)out,
                          "\t\t\t\t\t<ScalingKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</ScalingKey>\n"
                          ,paVar12->mTime,(double)(paVar12->mValue).x,(double)(paVar12->mValue).y,
                          (double)(paVar12->mValue).z);
                }
                fprintf((FILE *)out,"\t\t\t\t</ScalingKeyList>\n");
              }
              if (in_00->mNumRotationKeys != 0) {
                fprintf((FILE *)out,"\t\t\t\t<RotationKeyList num=\"%u\">\n",
                        (ulong)in_00->mNumRotationKeys);
                for (vc_2._4_4_ = 0; vc_2._4_4_ < in_00->mNumRotationKeys;
                    vc_2._4_4_ = vc_2._4_4_ + 1) {
                  paVar13 = in_00->mRotationKeys + vc_2._4_4_;
                  fprintf((FILE *)out,
                          "\t\t\t\t\t<RotationKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f %0 8f\n\t\t\t\t\t</RotationKey>\n"
                          ,paVar13->mTime,(double)(paVar13->mValue).x,(double)(paVar13->mValue).y,
                          (double)(paVar13->mValue).z,(double)(paVar13->mValue).w);
                }
                fprintf((FILE *)out,"\t\t\t\t</RotationKeyList>\n");
              }
            }
            fprintf((FILE *)out,"\t\t\t</NodeAnim>\n");
          }
          fprintf((FILE *)out,"\t\t</NodeAnimList>\n");
        }
        fprintf((FILE *)out,"\t</Animation>\n");
      }
      fprintf((FILE *)out,"</AnimationList>\n");
    }
    if (scene->mNumMeshes != 0) {
      fprintf((FILE *)out,"<MeshList num=\"%u\">\n",(ulong)scene->mNumMeshes);
      for (mesh._4_4_ = 0; mesh._4_4_ < scene->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
        this = scene->mMeshes[mesh._4_4_];
        pcVar9 = "";
        if ((this->mPrimitiveTypes & 1) != 0) {
          pcVar9 = "points";
        }
        pcVar10 = "";
        if ((this->mPrimitiveTypes & 2) != 0) {
          pcVar10 = "lines";
        }
        pcVar15 = "";
        if ((this->mPrimitiveTypes & 4) != 0) {
          pcVar15 = "triangles";
        }
        pcVar16 = "";
        if ((this->mPrimitiveTypes & 8) != 0) {
          pcVar16 = "polygons";
        }
        dVar8 = (double)CONCAT44((int)((ulong)dVar8 >> 0x20),this->mMaterialIndex);
        fprintf((FILE *)out,"\t<Mesh types=\"%s %s %s %s\" material_index=\"%u\">\n",pcVar9,pcVar10,
                pcVar15,pcVar16,dVar8);
        if (this->mNumBones != 0) {
          fprintf((FILE *)out,"\t\t<BoneList num=\"%u\">\n",(ulong)this->mNumBones);
          for (bone._4_4_ = 0; bone._4_4_ < this->mNumBones; bone._4_4_ = bone._4_4_ + 1) {
            in_01 = this->mBones[bone._4_4_];
            ConvertName((aiString *)((long)&tex + 4),&in_01->mName);
            dVar8 = (double)(in_01->mOffsetMatrix).c1;
            fprintf((FILE *)out,
                    "\t\t\t<Bone name=\"%s\">\n\t\t\t\t<Matrix4> \n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t</Matrix4> \n"
                    ,(double)(in_01->mOffsetMatrix).a1,(double)(in_01->mOffsetMatrix).a2,
                    (double)(in_01->mOffsetMatrix).a3,(double)(in_01->mOffsetMatrix).a4,
                    (double)(in_01->mOffsetMatrix).b1,(double)(in_01->mOffsetMatrix).b2,
                    (double)(in_01->mOffsetMatrix).b3,(double)(in_01->mOffsetMatrix).b4,&i);
            if ((!shortened) && (in_01->mNumWeights != 0)) {
              fprintf((FILE *)out,"\t\t\t\t<WeightList num=\"%u\">\n",(ulong)in_01->mNumWeights);
              for (wght._4_4_ = 0; wght._4_4_ < in_01->mNumWeights; wght._4_4_ = wght._4_4_ + 1) {
                fprintf((FILE *)out,
                        "\t\t\t\t\t<Weight index=\"%u\">\n\t\t\t\t\t\t%f\n\t\t\t\t\t</Weight>\n",
                        (double)in_01->mWeights[wght._4_4_].mWeight,
                        (ulong)in_01->mWeights[wght._4_4_].mVertexId);
              }
              fprintf((FILE *)out,"\t\t\t\t</WeightList>\n");
            }
            fprintf((FILE *)out,"\t\t\t</Bone>\n");
          }
          fprintf((FILE *)out,"\t\t</BoneList>\n");
        }
        if ((!shortened) && (this->mNumFaces != 0)) {
          fprintf((FILE *)out,"\t\t<FaceList num=\"%u\">\n",(ulong)this->mNumFaces);
          for (f._4_4_ = 0; f._4_4_ < this->mNumFaces; f._4_4_ = f._4_4_ + 1) {
            paVar14 = this->mFaces + f._4_4_;
            fprintf((FILE *)out,"\t\t\t<Face num=\"%u\">\n\t\t\t\t",(ulong)paVar14->mNumIndices);
            for (n_6 = 0; n_6 < paVar14->mNumIndices; n_6 = n_6 + 1) {
              fprintf((FILE *)out,"%u ",(ulong)paVar14->mIndices[n_6]);
            }
            fprintf((FILE *)out,"\n\t\t\t</Face>\n");
          }
          fprintf((FILE *)out,"\t\t</FaceList>\n");
        }
        bVar3 = aiMesh::HasPositions(this);
        if (bVar3) {
          fprintf((FILE *)out,"\t\t<Positions num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)this->mNumVertices);
          if (!shortened) {
            for (n_7 = 0; n_7 < this->mNumVertices; n_7 = n_7 + 1) {
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",(double)this->mVertices[n_7].x,
                      (double)this->mVertices[n_7].y,(double)this->mVertices[n_7].z);
            }
          }
          fprintf((FILE *)out,"\t\t</Positions>\n");
        }
        bVar3 = aiMesh::HasNormals(this);
        if (bVar3) {
          fprintf((FILE *)out,"\t\t<Normals num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)this->mNumVertices);
          if (!shortened) {
            for (n_8 = 0; n_8 < this->mNumVertices; n_8 = n_8 + 1) {
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",(double)this->mNormals[n_8].x,
                      (double)this->mNormals[n_8].y,(double)this->mNormals[n_8].z);
            }
          }
          fprintf((FILE *)out,"\t\t</Normals>\n");
        }
        bVar3 = aiMesh::HasTangentsAndBitangents(this);
        if (bVar3) {
          fprintf((FILE *)out,"\t\t<Tangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)this->mNumVertices);
          if (!shortened) {
            for (a_5 = 0; a_5 < this->mNumVertices; a_5 = a_5 + 1) {
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",(double)this->mTangents[a_5].x,
                      (double)this->mTangents[a_5].y,(double)this->mTangents[a_5].z);
            }
          }
          fprintf((FILE *)out,"\t\t</Tangents>\n");
          fprintf((FILE *)out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)this->mNumVertices);
          if (!shortened) {
            for (n_9 = 0; n_9 < this->mNumVertices; n_9 = n_9 + 1) {
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",(double)this->mBitangents[n_9].x,
                      (double)this->mBitangents[n_9].y,(double)this->mBitangents[n_9].z);
            }
          }
          fprintf((FILE *)out,"\t\t</Bitangents>\n");
        }
        for (n_10 = 0; (n_10 < 8 && (this->mTextureCoords[n_10] != (aiVector3D *)0x0));
            n_10 = n_10 + 1) {
          fprintf((FILE *)out,"\t\t<TextureCoords num=\"%u\" set=\"%u\" num_components=\"%u\"> \n",
                  (ulong)this->mNumVertices,(ulong)n_10,(ulong)this->mNumUVComponents[n_10]);
          if (!shortened) {
            if (this->mNumUVComponents[n_10] == 3) {
              for (a_6 = 0; a_6 < this->mNumVertices; a_6 = a_6 + 1) {
                fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                        (double)this->mTextureCoords[n_10][a_6].x,
                        (double)this->mTextureCoords[n_10][a_6].y,
                        (double)this->mTextureCoords[n_10][a_6].z);
              }
            }
            else {
              for (n_11 = 0; n_11 < this->mNumVertices; n_11 = n_11 + 1) {
                fprintf((FILE *)out,"\t\t%0 8f %0 8f\n",(double)this->mTextureCoords[n_10][n_11].x,
                        (double)this->mTextureCoords[n_10][n_11].y);
              }
            }
          }
          fprintf((FILE *)out,"\t\t</TextureCoords>\n");
        }
        for (local_61c = 0; (local_61c < 8 && (this->mColors[local_61c] != (aiColor4D *)0x0));
            local_61c = local_61c + 1) {
          fprintf((FILE *)out,"\t\t<Colors num=\"%u\" set=\"%u\" num_components=\"4\"> \n",
                  (ulong)this->mNumVertices,(ulong)local_61c);
          if (!shortened) {
            for (local_620 = 0; local_620 < this->mNumVertices; local_620 = local_620 + 1) {
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f %0 8f\n",
                      (double)this->mColors[local_61c][local_620].r,
                      (double)this->mColors[local_61c][local_620].g,
                      (double)this->mColors[local_61c][local_620].b,
                      (double)this->mColors[local_61c][local_620].a);
            }
          }
          fprintf((FILE *)out,"\t\t</Colors>\n");
        }
        fprintf((FILE *)out,"\t</Mesh>\n");
      }
      fprintf((FILE *)out,"</MeshList>\n");
    }
    fprintf((FILE *)out,"</Scene>\n</ASSIMP>");
    std::__cxx11::string::~string(local_98);
    return;
  }
  __assert_fail("nullptr != p",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0x36f,"void WriteDump(const aiScene *, FILE *, const char *, const char *, bool)");
}

Assistant:

void WriteDump(const aiScene* scene, FILE* out, const char* src, const char* cmd, bool shortened)
{
	time_t tt = ::time(NULL);
#if _WIN32
    tm* p = gmtime(&tt);
#else
    struct tm now;
    tm* p = gmtime_r(&tt, &now);
#endif
    ai_assert(nullptr != p);

	std::string c = cmd;
	std::string::size_type s; 

	// https://sourceforge.net/tracker/?func=detail&aid=3167364&group_id=226462&atid=1067632
	// -- not allowed in XML comments
	while((s = c.find("--")) != std::string::npos) {
		c[s] = '?';
	}
	aiString name;

	// write header
	fprintf(out,
		"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
		"<ASSIMP format_id=\"1\">\n\n"

		"<!-- XML Model dump produced by assimp dump\n"
		"  Library version: %u.%u.%u\n"
		"  Source: %s\n"
		"  Command line: %s\n"
		"  %s\n"
		"-->"
		" \n\n"
		"<Scene flags=\"%u\" postprocessing=\"%i\">\n",
		
		aiGetVersionMajor(),aiGetVersionMinor(),aiGetVersionRevision(),src,c.c_str(),asctime(p),
		scene->mFlags,
		0 /*globalImporter->GetEffectivePostProcessing()*/);

	// write the node graph
	WriteNode(scene->mRootNode, out, 0);

#if 0
		// write cameras
	for (unsigned int i = 0; i < scene->mNumCameras;++i) {
		aiCamera* cam  = scene->mCameras[i];
		ConvertName(name,cam->mName);

		// camera header
		fprintf(out,"\t<Camera parent=\"%s\">\n"
			"\t\t<Vector3 name=\"up\"        > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"lookat\"    > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"pos\"       > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Float   name=\"fov\"       > %f </Float>\n"
			"\t\t<Float   name=\"aspect\"    > %f </Float>\n"
			"\t\t<Float   name=\"near_clip\" > %f </Float>\n"
			"\t\t<Float   name=\"far_clip\"  > %f </Float>\n"
			"\t</Camera>\n",
			name.data,
			cam->mUp.x,cam->mUp.y,cam->mUp.z,
			cam->mLookAt.x,cam->mLookAt.y,cam->mLookAt.z,
			cam->mPosition.x,cam->mPosition.y,cam->mPosition.z,
			cam->mHorizontalFOV,cam->mAspect,cam->mClipPlaneNear,cam->mClipPlaneFar,i);
	}

	// write lights
	for (unsigned int i = 0; i < scene->mNumLights;++i) {
		aiLight* l  = scene->mLights[i];
		ConvertName(name,l->mName);

		// light header
		fprintf(out,"\t<Light parent=\"%s\"> type=\"%s\"\n"
			"\t\t<Vector3 name=\"diffuse\"   > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"specular\"  > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"ambient\"   > %0 8f %0 8f %0 8f </Vector3>\n",
			name.data,
			(l->mType == aiLightSource_DIRECTIONAL ? "directional" :
			(l->mType == aiLightSource_POINT ? "point" : "spot" )),
			l->mColorDiffuse.r, l->mColorDiffuse.g, l->mColorDiffuse.b,
			l->mColorSpecular.r,l->mColorSpecular.g,l->mColorSpecular.b,
			l->mColorAmbient.r, l->mColorAmbient.g, l->mColorAmbient.b);

		if (l->mType != aiLightSource_DIRECTIONAL) {
			fprintf(out,
				"\t\t<Vector3 name=\"pos\"       > %0 8f %0 8f %0 8f </Vector3>\n"
				"\t\t<Float   name=\"atten_cst\" > %f </Float>\n"
				"\t\t<Float   name=\"atten_lin\" > %f </Float>\n"
				"\t\t<Float   name=\"atten_sqr\" > %f </Float>\n",
				l->mPosition.x,l->mPosition.y,l->mPosition.z,
				l->mAttenuationConstant,l->mAttenuationLinear,l->mAttenuationQuadratic);
		}

		if (l->mType != aiLightSource_POINT) {
			fprintf(out,
				"\t\t<Vector3 name=\"lookat\"    > %0 8f %0 8f %0 8f </Vector3>\n",
				l->mDirection.x,l->mDirection.y,l->mDirection.z);
		}

		if (l->mType == aiLightSource_SPOT) {
			fprintf(out,
				"\t\t<Float   name=\"cone_out\" > %f </Float>\n"
				"\t\t<Float   name=\"cone_inn\" > %f </Float>\n",
				l->mAngleOuterCone,l->mAngleInnerCone);
		}
		fprintf(out,"\t</Light>\n");
	}
#endif

	// write textures
	if (scene->mNumTextures) {
		fprintf(out,"<TextureList num=\"%u\">\n",scene->mNumTextures);
		for (unsigned int i = 0; i < scene->mNumTextures;++i) {
			aiTexture* tex  = scene->mTextures[i];
			bool compressed = (tex->mHeight == 0);

			// mesh header
			fprintf(out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
				(compressed ? -1 : tex->mWidth),(compressed ? -1 : tex->mHeight),
				(compressed ? "true" : "false"));

			if (compressed) {
				fprintf(out,"\t\t<Data length=\"%u\"> \n",tex->mWidth);

				if (!shortened) {
					for (unsigned int n = 0; n < tex->mWidth;++n) {
						fprintf(out,"\t\t\t%2x",reinterpret_cast<uint8_t*>(tex->pcData)[n]);
						if (n && !(n % 50)) {
							fprintf(out,"\n");
						}
					}
				}
			}
			else if (!shortened){
				fprintf(out,"\t\t<Data length=\"%i\"> \n",tex->mWidth*tex->mHeight*4);

				// const unsigned int width = (unsigned int)log10((double)std::max(tex->mHeight,tex->mWidth))+1;
				for (unsigned int y = 0; y < tex->mHeight;++y) {
					for (unsigned int x = 0; x < tex->mWidth;++x) {
						aiTexel* tx = tex->pcData + y*tex->mWidth+x;
						unsigned int r = tx->r,g=tx->g,b=tx->b,a=tx->a;
						fprintf(out,"\t\t\t%2x %2x %2x %2x",r,g,b,a);

						// group by four for readibility
						if (0 == (x+y*tex->mWidth) % 4)
							fprintf(out,"\n");
					}
				}
			}
			fprintf(out,"\t\t</Data>\n\t</Texture>\n");
		}
		fprintf(out,"</TextureList>\n");
	}

	// write materials
	if (scene->mNumMaterials) {
		fprintf(out,"<MaterialList num=\"%u\">\n",scene->mNumMaterials);
		for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
			const aiMaterial* mat = scene->mMaterials[i];

			fprintf(out,"\t<Material>\n");
			fprintf(out,"\t\t<MatPropertyList  num=\"%u\">\n",mat->mNumProperties);
			for (unsigned int n = 0; n < mat->mNumProperties;++n) {

				const aiMaterialProperty* prop = mat->mProperties[n];
				const char* sz = "";
				if (prop->mType == aiPTI_Float) {
					sz = "float";
				}
				else if (prop->mType == aiPTI_Integer) {
					sz = "integer";
				}
				else if (prop->mType == aiPTI_String) {
					sz = "string";
				}
				else if (prop->mType == aiPTI_Buffer) {
					sz = "binary_buffer";
				}

				fprintf(out,"\t\t\t<MatProperty key=\"%s\" \n\t\t\ttype=\"%s\" tex_usage=\"%s\" tex_index=\"%u\"",
					prop->mKey.data, sz,
					::TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex);

				if (prop->mType == aiPTI_Float) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength/sizeof(float)));

					for (unsigned int p = 0; p < prop->mDataLength/sizeof(float);++p) {
						fprintf(out,"%f ",*((float*)(prop->mData+p*sizeof(float))));
					}
				}
				else if (prop->mType == aiPTI_Integer) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength/sizeof(int)));

					for (unsigned int p = 0; p < prop->mDataLength/sizeof(int);++p) {
						fprintf(out,"%i ",*((int*)(prop->mData+p*sizeof(int))));
					}
				}
				else if (prop->mType == aiPTI_Buffer) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength));

					for (unsigned int p = 0; p < prop->mDataLength;++p) {
						fprintf(out,"%2x ",prop->mData[p]);
						if (p && 0 == p%30) {
							fprintf(out,"\n\t\t\t\t");
						}
					}
				}
				else if (prop->mType == aiPTI_String) {
					fprintf(out,">\n\t\t\t\t\"%s\"",encodeXML(prop->mData+4).c_str() /* skip length */);
				}
				fprintf(out,"\n\t\t\t</MatProperty>\n");
			}
			fprintf(out,"\t\t</MatPropertyList>\n");
			fprintf(out,"\t</Material>\n");
		}
		fprintf(out,"</MaterialList>\n");
	}

	// write animations
	if (scene->mNumAnimations) {
		fprintf(out,"<AnimationList num=\"%u\">\n",scene->mNumAnimations);
		for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
			aiAnimation* anim = scene->mAnimations[i];

			// anim header
			ConvertName(name,anim->mName);
			fprintf(out,"\t<Animation name=\"%s\" duration=\"%e\" tick_cnt=\"%e\">\n",
				name.data, anim->mDuration, anim->mTicksPerSecond);

			// write bone animation channels
			if (anim->mNumChannels) {
				fprintf(out,"\t\t<NodeAnimList num=\"%u\">\n",anim->mNumChannels);
				for (unsigned int n = 0; n < anim->mNumChannels;++n) {
					aiNodeAnim* nd = anim->mChannels[n];

					// node anim header
					ConvertName(name,nd->mNodeName);
					fprintf(out,"\t\t\t<NodeAnim node=\"%s\">\n",name.data);

					if (!shortened) {
						// write position keys
						if (nd->mNumPositionKeys) {
							fprintf(out,"\t\t\t\t<PositionKeyList num=\"%u\">\n",nd->mNumPositionKeys);
							for (unsigned int a = 0; a < nd->mNumPositionKeys;++a) {
								aiVectorKey* vc = nd->mPositionKeys+a;
								fprintf(out,"\t\t\t\t\t<PositionKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</PositionKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z);
							}
							fprintf(out,"\t\t\t\t</PositionKeyList>\n");
						}

						// write scaling keys
						if (nd->mNumScalingKeys) {
							fprintf(out,"\t\t\t\t<ScalingKeyList num=\"%u\">\n",nd->mNumScalingKeys);
							for (unsigned int a = 0; a < nd->mNumScalingKeys;++a) {
								aiVectorKey* vc = nd->mScalingKeys+a;
								fprintf(out,"\t\t\t\t\t<ScalingKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</ScalingKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z);
							}
							fprintf(out,"\t\t\t\t</ScalingKeyList>\n");
						}

						// write rotation keys
						if (nd->mNumRotationKeys) {
							fprintf(out,"\t\t\t\t<RotationKeyList num=\"%u\">\n",nd->mNumRotationKeys);
							for (unsigned int a = 0; a < nd->mNumRotationKeys;++a) {
								aiQuatKey* vc = nd->mRotationKeys+a;
								fprintf(out,"\t\t\t\t\t<RotationKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f %0 8f\n\t\t\t\t\t</RotationKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z,vc->mValue.w);
							}
							fprintf(out,"\t\t\t\t</RotationKeyList>\n");
						}
					}
					fprintf(out,"\t\t\t</NodeAnim>\n");
				}
				fprintf(out,"\t\t</NodeAnimList>\n");
			}
			fprintf(out,"\t</Animation>\n");
		}
		fprintf(out,"</AnimationList>\n");
	}

	// write meshes
	if (scene->mNumMeshes) {
		fprintf(out,"<MeshList num=\"%u\">\n",scene->mNumMeshes);
		for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
			aiMesh* mesh = scene->mMeshes[i];
			// const unsigned int width = (unsigned int)log10((double)mesh->mNumVertices)+1;

			// mesh header
			fprintf(out,"\t<Mesh types=\"%s %s %s %s\" material_index=\"%u\">\n",
				(mesh->mPrimitiveTypes & aiPrimitiveType_POINT    ? "points"    : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_LINE     ? "lines"     : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE ? "triangles" : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_POLYGON  ? "polygons"  : ""),
				mesh->mMaterialIndex);

			// bones
			if (mesh->mNumBones) {
				fprintf(out,"\t\t<BoneList num=\"%u\">\n",mesh->mNumBones);

				for (unsigned int n = 0; n < mesh->mNumBones;++n) {
					aiBone* bone = mesh->mBones[n];

					ConvertName(name,bone->mName);
					// bone header
					fprintf(out,"\t\t\t<Bone name=\"%s\">\n"
						"\t\t\t\t<Matrix4> \n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t</Matrix4> \n",
						name.data,
						bone->mOffsetMatrix.a1,bone->mOffsetMatrix.a2,bone->mOffsetMatrix.a3,bone->mOffsetMatrix.a4,
						bone->mOffsetMatrix.b1,bone->mOffsetMatrix.b2,bone->mOffsetMatrix.b3,bone->mOffsetMatrix.b4,
						bone->mOffsetMatrix.c1,bone->mOffsetMatrix.c2,bone->mOffsetMatrix.c3,bone->mOffsetMatrix.c4,
						bone->mOffsetMatrix.d1,bone->mOffsetMatrix.d2,bone->mOffsetMatrix.d3,bone->mOffsetMatrix.d4);

					if (!shortened && bone->mNumWeights) {
						fprintf(out,"\t\t\t\t<WeightList num=\"%u\">\n",bone->mNumWeights);

						// bone weights
						for (unsigned int a = 0; a < bone->mNumWeights;++a) {
							aiVertexWeight* wght = bone->mWeights+a;

							fprintf(out,"\t\t\t\t\t<Weight index=\"%u\">\n\t\t\t\t\t\t%f\n\t\t\t\t\t</Weight>\n",
								wght->mVertexId,wght->mWeight);
						}
						fprintf(out,"\t\t\t\t</WeightList>\n");
					}
					fprintf(out,"\t\t\t</Bone>\n");
				}
				fprintf(out,"\t\t</BoneList>\n");
			}

			// faces
			if (!shortened && mesh->mNumFaces) {
				fprintf(out,"\t\t<FaceList num=\"%u\">\n",mesh->mNumFaces);
				for (unsigned int n = 0; n < mesh->mNumFaces; ++n) {
					aiFace& f = mesh->mFaces[n];
					fprintf(out,"\t\t\t<Face num=\"%u\">\n"
						"\t\t\t\t",f.mNumIndices);

					for (unsigned int j = 0; j < f.mNumIndices;++j)
						fprintf(out,"%u ",f.mIndices[j]);

					fprintf(out,"\n\t\t\t</Face>\n");
				}
				fprintf(out,"\t\t</FaceList>\n");
			}

			// vertex positions
			if (mesh->HasPositions()) {
				fprintf(out,"\t\t<Positions num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mVertices[n].x,
							mesh->mVertices[n].y,
							mesh->mVertices[n].z);
					}
				}
				fprintf(out,"\t\t</Positions>\n");
			}

			// vertex normals
			if (mesh->HasNormals()) {
				fprintf(out,"\t\t<Normals num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mNormals[n].x,
							mesh->mNormals[n].y,
							mesh->mNormals[n].z);
					}
				}
				else {
				}
				fprintf(out,"\t\t</Normals>\n");
			}

			// vertex tangents and bitangents
			if (mesh->HasTangentsAndBitangents()) {
				fprintf(out,"\t\t<Tangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mTangents[n].x,
							mesh->mTangents[n].y,
							mesh->mTangents[n].z);
					}
				}
				fprintf(out,"\t\t</Tangents>\n");

				fprintf(out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mBitangents[n].x,
							mesh->mBitangents[n].y,
							mesh->mBitangents[n].z);
					}
				}
				fprintf(out,"\t\t</Bitangents>\n");
			}

			// texture coordinates
			for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
				if (!mesh->mTextureCoords[a])
					break;

				fprintf(out,"\t\t<TextureCoords num=\"%u\" set=\"%u\" num_components=\"%u\"> \n",mesh->mNumVertices,
					a,mesh->mNumUVComponents[a]);
				
				if (!shortened) {
					if (mesh->mNumUVComponents[a] == 3) {
						for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
							fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
								mesh->mTextureCoords[a][n].x,
								mesh->mTextureCoords[a][n].y,
								mesh->mTextureCoords[a][n].z);
						}
					}
					else {
						for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
							fprintf(out,"\t\t%0 8f %0 8f\n",
								mesh->mTextureCoords[a][n].x,
								mesh->mTextureCoords[a][n].y);
						}
					}
				}
				fprintf(out,"\t\t</TextureCoords>\n");
			}

			// vertex colors
			for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
				if (!mesh->mColors[a])
					break;
				fprintf(out,"\t\t<Colors num=\"%u\" set=\"%u\" num_components=\"4\"> \n",mesh->mNumVertices,a);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f %0 8f\n",
							mesh->mColors[a][n].r,
							mesh->mColors[a][n].g,
							mesh->mColors[a][n].b,
							mesh->mColors[a][n].a);
					}
				}
				fprintf(out,"\t\t</Colors>\n");
			}
			fprintf(out,"\t</Mesh>\n");
		}
		fprintf(out,"</MeshList>\n");
	}
	fprintf(out,"</Scene>\n</ASSIMP>");
}